

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool ON_BinaryArchive::ArchiveContains3dmTable
               (ON_3dmArchiveTableType table,uint archive_3dm_version,uint opennurbs_library_version
               )

{
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_19;
  bool rc;
  uint opennurbs_library_version_local;
  uint archive_3dm_version_local;
  ON_3dmArchiveTableType table_local;
  
  if (archive_3dm_version == 0) {
    return false;
  }
  if (5 < archive_3dm_version) {
    if (archive_3dm_version < 0x32) {
      return false;
    }
    if (archive_3dm_version % 10 != 0) {
      return false;
    }
  }
  if ((archive_3dm_version < 3) || (opennurbs_library_version != 0)) {
    if (table == Unset) {
      local_19 = false;
    }
    else if (table == start_section) {
      local_19 = true;
    }
    else if (table == properties_table) {
      local_19 = true;
    }
    else if (table == settings_table) {
      local_19 = true;
    }
    else if (table == bitmap_table) {
      local_19 = 1 < archive_3dm_version;
    }
    else if (table == texture_mapping_table) {
      local_21 = 3 < archive_3dm_version && 0xbf38e85 < opennurbs_library_version;
      local_19 = local_21;
    }
    else if (table == material_table) {
      local_19 = true;
    }
    else if (table == linetype_table) {
      local_22 = 3 < archive_3dm_version && 0xbf36f81 < opennurbs_library_version;
      local_19 = local_22;
    }
    else if (table == layer_table) {
      local_19 = true;
    }
    else if (table == group_table) {
      local_23 = 1 < archive_3dm_version && 0xbebf1b1 < opennurbs_library_version;
      local_19 = local_23;
    }
    else if (table == text_style_table) {
      local_24 = 2 < archive_3dm_version && 0xbed6c7b < opennurbs_library_version;
      local_19 = local_24;
    }
    else if (table == dimension_style_table) {
      local_25 = 2 < archive_3dm_version && 0xbed6ccb < opennurbs_library_version;
      local_19 = local_25;
    }
    else if (table == light_table) {
      local_19 = true;
    }
    else if (table == hatchpattern_table) {
      local_26 = 3 < archive_3dm_version && 0xbf1f025 < opennurbs_library_version;
      local_19 = local_26;
    }
    else if (table == instance_definition_table) {
      local_27 = 2 < archive_3dm_version && 0xbeee335 < opennurbs_library_version;
      local_19 = local_27;
    }
    else if (table == object_table) {
      local_19 = true;
    }
    else if (table == historyrecord_table) {
      local_28 = 3 < archive_3dm_version && 0xbf4ee5b < opennurbs_library_version;
      local_19 = local_28;
    }
    else if (table == user_table) {
      local_19 = 3 < archive_3dm_version;
    }
    else if (table == end_mark) {
      local_19 = true;
    }
    else {
      local_19 = false;
    }
    archive_3dm_version_local._3_1_ = local_19;
  }
  else {
    archive_3dm_version_local._3_1_ = false;
  }
  return archive_3dm_version_local._3_1_;
}

Assistant:

bool ON_BinaryArchive::ArchiveContains3dmTable(
  ON_3dmArchiveTableType table,
  unsigned int archive_3dm_version,
  unsigned int opennurbs_library_version
  )
{
  if ( archive_3dm_version <= 0 )
    return false;
  if (archive_3dm_version > 5)
  {
    if (archive_3dm_version < 50)
      return false;
    if (0 != archive_3dm_version % 10)
      return false;
  }
  if ( archive_3dm_version >= 3 && opennurbs_library_version <= 0 )
    return false;

  bool rc;
  switch (table)
  {
  case ON_3dmArchiveTableType::Unset:
    rc = false;
    break;
  case ON_3dmArchiveTableType::start_section:
    rc = true;
    break;
  case ON_3dmArchiveTableType::properties_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::settings_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::bitmap_table:
    rc = (archive_3dm_version >= 2);
    break;
  case ON_3dmArchiveTableType::texture_mapping_table:
    rc = (archive_3dm_version >= 4 && opennurbs_library_version >= 200511110);
    break;
  case ON_3dmArchiveTableType::material_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::linetype_table:
    rc = (archive_3dm_version >= 4 && opennurbs_library_version >= 200503170 );
    break;
  case ON_3dmArchiveTableType::layer_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::group_table:
    rc = (archive_3dm_version >= 2 && opennurbs_library_version >= 200012210);
    break;
  case ON_3dmArchiveTableType::text_style_table:
    rc =  (archive_3dm_version >= 3 && opennurbs_library_version >= 200109180);
    break;
  case ON_3dmArchiveTableType::dimension_style_table:
    rc =  (archive_3dm_version >= 3 && opennurbs_library_version >= 200109260);
    break;
  case ON_3dmArchiveTableType::light_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::hatchpattern_table:
    rc = (archive_3dm_version >= 4 && opennurbs_library_version >= 200405030);
    break;
  case ON_3dmArchiveTableType::instance_definition_table:
    rc = (archive_3dm_version >= 3 && opennurbs_library_version >= 200205110);
    break;
  case ON_3dmArchiveTableType::object_table:
    rc = true;
    break;
  case ON_3dmArchiveTableType::historyrecord_table:
    rc = ( archive_3dm_version >= 4 && opennurbs_library_version >= 200601180 );
    break;
  case ON_3dmArchiveTableType::user_table:
    rc = ( archive_3dm_version >= 4);
    break;
  case ON_3dmArchiveTableType::end_mark:
    rc = true;
    break;
  default:
    rc = false;
    break;
  }

  return rc;
}